

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>,Eigen::internal::swap_assign_op<float>>
               (Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *dst,
               Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *src,
               swap_assign_op<float> *func)

{
  undefined8 func_00;
  Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  swap_assign_op<float> *func_local;
  Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *src_local;
  Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true> *dst_local;
  
  srcEvaluator.super_block_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  ._8_8_ = func;
  evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)local_30,
             src);
  resize_if_allowed<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,3,1,true>,Eigen::internal::swap_assign_op<float>>
            (dst,src,(swap_assign_op<float> *)
                     srcEvaluator.
                     super_block_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                     ._8_8_);
  evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             &kernel.
              super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
              .m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_block_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
            ._8_8_;
  dstExpr = EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>::
            const_cast_derived((EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                                *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>
              *)local_70,
             (evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             &kernel.
              super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
              .m_dstExpr,
             (evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)local_30,
             (Functor *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>,_3,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_0>
         *)local_70);
  evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             &kernel.
              super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_Eigen::internal::swap_assign_op<float>,_1>
              .m_dstExpr);
  evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}